

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store(XMLWriter *this,DirectionalLight *light,ssize_t id)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  int in_EDX;
  long in_RSI;
  XMLWriter *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vec3fa dy;
  Vec3fa dx;
  Vec3fa dx1;
  Vec3fa dx0;
  vfloat4 b1;
  vfloat4 a1;
  vfloat4 b0;
  vfloat4 a0;
  __m128 mask;
  __m128 c_3;
  __m128 r;
  __m128 a_3;
  __m128 c_5;
  __m128 r_1;
  __m128 a_5;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c_4;
  vfloat4 b_3;
  vfloat4 a_4;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  AffineSpace3fa *in_stack_ffffffffffffe8a0;
  allocator *paVar10;
  char *name;
  XMLWriter *this_00;
  allocator local_1729;
  string local_1728 [32];
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined1 local_16f8 [16];
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined1 local_16c8 [16];
  undefined1 local_16b8 [16];
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  allocator local_1681;
  string local_1680 [32];
  int local_1660;
  long local_1658;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  ulong local_1628;
  ulong uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  ulong local_1608;
  ulong uStack_1600;
  ulong local_15f8;
  ulong uStack_15f0;
  undefined1 (*local_15e8) [16];
  undefined8 *local_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 *local_15c8;
  undefined8 *local_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined1 local_1588 [16];
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined1 local_1558 [16];
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 *local_1520;
  undefined1 (*local_1518) [16];
  undefined8 *local_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 *local_14f0;
  undefined1 *local_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 *local_14b0;
  undefined1 *local_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 *local_1470;
  undefined8 *local_1468;
  undefined8 *local_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 *local_1440;
  undefined8 *local_1438;
  undefined8 *local_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 *local_1410;
  undefined1 *local_1408;
  undefined8 *local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 *local_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 *local_13c0;
  undefined8 *local_13b8;
  undefined8 *local_13b0;
  undefined8 *local_13a8;
  undefined8 *local_13a0;
  undefined8 *local_1398;
  undefined8 *local_1390;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  undefined8 *local_1378;
  undefined1 *local_1370;
  undefined8 *local_1368;
  undefined8 *local_1360;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  undefined8 *local_1348;
  undefined8 *local_1340;
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 *local_12d8;
  undefined8 *local_12d0;
  undefined8 *local_12c8;
  undefined8 *local_12c0;
  undefined1 *local_12b8;
  undefined8 *local_12b0;
  undefined8 *local_12a8;
  undefined8 *local_12a0;
  undefined8 *local_1298;
  undefined8 *local_1290;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  undefined8 local_1278;
  undefined8 uStack_1270;
  float local_1268;
  float fStack_1264;
  float fStack_1260;
  float fStack_125c;
  undefined8 *local_1250;
  undefined8 *local_1248;
  undefined8 *local_1240;
  float fStack_1234;
  float fStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 *local_11f8;
  undefined1 *local_11f0;
  undefined1 *local_11e8;
  undefined8 *local_11e0;
  undefined8 *local_11d8;
  undefined8 *local_11d0;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  undefined8 *local_11b8;
  undefined1 *local_11b0;
  undefined1 *local_11a8;
  undefined1 *local_11a0;
  undefined8 *local_1198;
  undefined8 *local_1190;
  undefined8 *local_1188;
  undefined8 *local_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  float local_1164;
  undefined4 local_1160;
  float local_115c;
  ulong *local_1158;
  float local_114c;
  float local_1148;
  undefined4 local_1144;
  ulong *local_1140;
  ulong local_1138;
  ulong uStack_1130;
  undefined4 local_1128;
  float local_1124;
  float local_1120;
  undefined4 local_111c;
  ulong local_1118;
  ulong uStack_1110;
  float local_1108;
  undefined4 local_1104;
  float local_1100;
  undefined4 local_10fc;
  undefined8 *local_10f8;
  undefined8 *local_10f0;
  ulong *local_10e8;
  undefined8 *local_10e0;
  char *local_10d8;
  XMLWriter *pXStack_10d0;
  ulong *local_10c8;
  ulong *local_10c0;
  undefined1 local_10b1;
  ulong *local_10b0;
  ulong local_10a8;
  ulong uStack_10a0;
  ulong *local_1090;
  undefined4 local_1088;
  undefined4 uStack_1084;
  undefined4 uStack_1080;
  undefined4 uStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  ulong uStack_1060;
  ulong *local_1058;
  ulong *local_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 *local_1038;
  undefined8 *local_1030;
  ulong local_1028;
  ulong uStack_1020;
  ulong *local_1018;
  ulong *local_1010;
  long local_1008;
  ulong uStack_1000;
  ulong *local_ff8;
  ulong *local_ff0;
  undefined1 (*local_fe8) [16];
  undefined8 *local_fe0;
  undefined8 *local_fd8;
  undefined8 *local_fd0;
  undefined8 *local_fc8;
  undefined8 *local_fc0;
  undefined8 *local_fb8;
  undefined1 *local_fb0;
  undefined1 (*local_fa8) [16];
  undefined8 *local_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  float local_f7c;
  ulong *local_f78;
  undefined8 *local_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  float local_f4c;
  undefined8 *local_f48;
  undefined8 *local_f40;
  ulong local_f38;
  undefined8 uStack_f30;
  undefined1 local_f28 [16];
  ulong local_f18;
  undefined8 uStack_f10;
  float local_efc;
  ulong local_ef8;
  undefined8 uStack_ef0;
  undefined1 local_ee8 [16];
  ulong local_ed8;
  undefined8 uStack_ed0;
  float local_ec4;
  undefined8 *local_ec0;
  undefined8 *local_eb8;
  undefined8 *local_eb0;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  undefined8 *local_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 *local_e60;
  ulong *local_e58;
  undefined8 *local_e50;
  float local_e48;
  float fStack_e44;
  float fStack_e40;
  float fStack_e3c;
  undefined8 *local_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  ulong local_e18;
  ulong uStack_e10;
  ulong *local_e00;
  ulong *local_df8;
  long *local_df0;
  undefined4 local_de8;
  float fStack_de4;
  float fStack_de0;
  undefined4 uStack_ddc;
  long *local_dd0;
  ulong local_dc8;
  ulong uStack_dc0;
  ulong local_db8;
  ulong uStack_db0;
  ulong *local_da0;
  ulong *local_d98;
  ulong *local_d90;
  float local_d88;
  undefined4 uStack_d84;
  float fStack_d80;
  undefined4 uStack_d7c;
  ulong *local_d70;
  ulong local_d68;
  ulong uStack_d60;
  ulong local_d58;
  ulong uStack_d50;
  undefined8 *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  undefined8 *local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  ulong *local_ce0;
  ulong *local_cd8;
  undefined8 *local_cd0;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  undefined4 uStack_cbc;
  undefined8 *local_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  undefined8 local_c98;
  ulong uStack_c90;
  float local_c84;
  undefined8 *local_c80;
  float local_c74;
  undefined8 *local_c70;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  float local_c4c;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  float local_c2c;
  undefined1 local_c28 [16];
  undefined4 local_c0c;
  undefined1 local_c08 [16];
  undefined4 local_bec;
  undefined1 local_be8 [16];
  float local_bcc;
  undefined1 local_bc8 [16];
  undefined4 local_bac;
  undefined1 local_ba8 [16];
  undefined4 local_b8c;
  undefined1 local_b88 [16];
  float local_b6c;
  ulong local_b68;
  undefined8 uStack_b60;
  ulong local_b58;
  undefined8 uStack_b50;
  ulong local_b48;
  undefined8 uStack_b40;
  ulong local_b38;
  undefined8 uStack_b30;
  ulong local_b28;
  undefined8 uStack_b20;
  ulong local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  ulong local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  ulong local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  ulong local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  ulong local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  ulong local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  ulong local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  ulong local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  ulong local_9d8;
  undefined8 uStack_9d0;
  ulong local_9c8;
  undefined8 uStack_9c0;
  ulong local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  char *local_968;
  XMLWriter *pXStack_960;
  ulong local_958;
  ulong uStack_950;
  ulong local_948;
  ulong uStack_940;
  ulong local_938;
  ulong uStack_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  ulong uStack_910;
  char *local_908;
  XMLWriter *pXStack_900;
  ulong local_8f8;
  ulong uStack_8f0;
  char *local_8e8;
  XMLWriter *pXStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  long local_898;
  ulong uStack_890;
  long *local_880;
  long local_878;
  ulong uStack_870;
  long *local_868;
  undefined8 *local_860;
  undefined8 local_858;
  undefined8 uStack_850;
  ulong local_848;
  ulong uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  ulong local_808;
  ulong uStack_800;
  ulong *local_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong *local_7d8;
  undefined8 *local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 *local_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  ulong uStack_6e0;
  undefined8 *local_6d0;
  undefined8 local_6c8;
  ulong uStack_6c0;
  undefined8 *local_6b8;
  undefined8 *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  ulong *local_670;
  undefined8 *local_668;
  long *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  ulong *local_630;
  undefined8 *local_628;
  long *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  ulong *local_508;
  undefined8 *local_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  ulong *local_4d8;
  undefined8 *local_4d0;
  ulong *local_4c8;
  ulong *local_4c0;
  float local_4b8;
  undefined4 uStack_4b4;
  float fStack_4b0;
  undefined4 uStack_4ac;
  ulong *local_4a8;
  undefined8 *local_4a0;
  ulong *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  long *local_448;
  undefined8 *local_440;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined8 *local_420;
  undefined8 *local_418;
  long *local_410;
  long *local_408;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 *local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  long local_3c8;
  ulong uStack_3c0;
  long *local_3b0;
  ulong *local_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 *local_380;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  ulong local_368;
  ulong uStack_360;
  ulong *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  ulong uStack_2a0;
  undefined8 *local_290;
  long *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  long local_248;
  ulong uStack_240;
  long *local_230;
  ulong *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 *local_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  ulong uStack_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  long local_f8;
  ulong uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  ulong uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  ulong uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_1658 = in_RSI;
  local_1660 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1680,"DirectionalLight",&local_1681);
  open(in_RDI,(char *)local_1680,local_1660);
  std::__cxx11::string::~string(local_1680);
  std::allocator<char>::~allocator((allocator<char> *)&local_1681);
  local_15e8 = (undefined1 (*) [16])(local_1658 + 0x10);
  local_15e0 = &local_1708;
  local_1148 = *(float *)(local_1658 + 0x18);
  local_114c = -*(float *)(local_1658 + 0x14);
  local_1140 = &local_15f8;
  local_1144 = 0;
  local_111c = 0;
  local_1128 = 0;
  local_1138 = (ulong)(uint)local_1148 << 0x20;
  uStack_1130 = (ulong)(uint)local_114c;
  local_115c = -*(float *)(local_1658 + 0x18);
  local_1164 = *(float *)*local_15e8;
  local_1158 = &local_1608;
  local_1160 = 0;
  local_10fc = 0;
  local_1104 = 0;
  local_1118 = (ulong)(uint)local_115c;
  uStack_1110 = (ulong)(uint)local_1164;
  local_df0 = &local_1008;
  local_de8 = 0;
  fStack_de4 = local_1148 * local_1148;
  fStack_de0 = local_114c * local_114c;
  uStack_ddc = 0;
  local_878 = (ulong)(uint)fStack_de4 << 0x20;
  uStack_870 = (ulong)(uint)fStack_de0;
  local_868 = &local_898;
  local_658 = &local_8a8;
  local_3f8 = CONCAT44(fStack_de4,fStack_de4);
  uStack_3f0 = CONCAT44(fStack_de4,fStack_de4);
  local_618 = &local_8b8;
  local_278 = CONCAT44(fStack_de0,fStack_de0);
  uStack_270 = CONCAT44(fStack_de0,fStack_de0);
  local_488 = &local_8d8;
  local_438 = fStack_de4 + 0.0;
  fStack_434 = fStack_de4 + fStack_de4;
  fStack_430 = fStack_de0 + fStack_de4;
  fStack_42c = fStack_de4 + 0.0;
  local_d8 = CONCAT44(fStack_434,local_438);
  uStack_d0 = CONCAT44(fStack_42c,fStack_430);
  local_860 = &local_8c8;
  local_478 = local_438 + fStack_de0;
  fStack_474 = fStack_434 + fStack_de0;
  fStack_470 = fStack_430 + fStack_de0;
  fStack_46c = fStack_42c + fStack_de0;
  local_858 = CONCAT44(fStack_474,local_478);
  uStack_850 = CONCAT44(fStack_46c,fStack_470);
  local_d90 = &local_1028;
  local_d88 = local_115c * local_115c;
  uStack_d84 = 0;
  fStack_d80 = local_1164 * local_1164;
  uStack_d7c = 0;
  local_7e8 = (ulong)(uint)local_d88;
  uStack_7e0 = (ulong)(uint)fStack_d80;
  local_7d8 = &local_808;
  local_668 = &local_818;
  local_398 = 0;
  uStack_390 = 0;
  local_628 = &local_828;
  local_218 = CONCAT44(fStack_d80,fStack_d80);
  uStack_210 = CONCAT44(fStack_d80,fStack_d80);
  local_508 = &local_848;
  local_4b8 = local_d88 + 0.0;
  uStack_4b4 = 0;
  fStack_4b0 = fStack_d80 + 0.0;
  uStack_4ac = 0;
  local_98 = (ulong)(uint)local_4b8;
  uStack_90 = (ulong)(uint)fStack_4b0;
  local_7d0 = &local_838;
  local_4f8 = local_4b8 + fStack_d80;
  fStack_4f4 = fStack_d80 + 0.0;
  fStack_4f0 = fStack_4b0 + fStack_d80;
  fStack_4ec = fStack_d80 + 0.0;
  local_7c8 = CONCAT44(fStack_4f4,local_4f8);
  uStack_7c0 = CONCAT44(fStack_4ec,fStack_4f0);
  local_10b1 = local_4f8 < local_478;
  local_10b0 = &local_1628;
  local_10c0 = &local_15f8;
  local_10c8 = &local_1608;
  if ((bool)local_10b1) {
    local_978 = 0;
    uStack_970 = 0;
    local_988 = 0;
    uStack_980 = 0;
    local_998 = 0;
    uStack_990 = 0;
    local_9a8 = 0;
    uStack_9a0 = 0;
    local_1088 = 0xffffffff;
    uStack_1084 = 0xffffffff;
    uStack_1080 = 0xffffffff;
    uStack_107c = 0xffffffff;
    name = (char *)0xffffffffffffffff;
    this_00 = (XMLWriter *)0xffffffffffffffff;
  }
  else {
    local_1078 = 0;
    uStack_1070 = 0;
    name = (char *)0x0;
    this_00 = (XMLWriter *)0x0;
  }
  local_928 = (ulong)name & local_1138;
  uStack_920 = (ulong)this_00 & uStack_1130;
  local_938 = ~(ulong)name & local_1118;
  uStack_930 = ~(ulong)this_00 & uStack_1110;
  local_10a8 = local_928 | local_938;
  uStack_10a0 = uStack_920 | uStack_930;
  local_10e8 = &local_1628;
  local_1520 = &local_1618;
  local_cd0 = &local_1068;
  local_c98._0_4_ = (float)local_938;
  local_c98._4_4_ = (float)(local_928 >> 0x20);
  uStack_c90._0_4_ = (float)uStack_10a0;
  local_cc8 = (float)local_c98 * (float)local_c98;
  fStack_cc4 = local_c98._4_4_ * local_c98._4_4_;
  fStack_cc0 = (float)uStack_c90 * (float)uStack_c90;
  uStack_cbc = 0;
  local_6c8 = CONCAT44(fStack_cc4,local_cc8);
  uStack_6c0 = (ulong)(uint)fStack_cc0;
  local_6b8 = &local_6e8;
  local_688 = &local_6f8;
  local_2d8 = CONCAT44(fStack_cc4,fStack_cc4);
  uStack_2d0 = CONCAT44(fStack_cc4,fStack_cc4);
  local_648 = &local_708;
  local_158 = CONCAT44(fStack_cc0,fStack_cc0);
  uStack_150 = CONCAT44(fStack_cc0,fStack_cc0);
  local_608 = &local_728;
  local_5b8 = local_cc8 + fStack_cc4;
  fStack_5b4 = fStack_cc4 + fStack_cc4;
  fStack_5b0 = fStack_cc0 + fStack_cc4;
  fStack_5ac = fStack_cc4 + 0.0;
  local_18 = CONCAT44(fStack_5b4,local_5b8);
  uStack_10 = CONCAT44(fStack_5ac,fStack_5b0);
  local_6b0 = &local_718;
  local_efc = local_5b8 + fStack_cc0;
  fStack_5f4 = fStack_5b4 + fStack_cc0;
  fStack_5f0 = fStack_5b0 + fStack_cc0;
  fStack_5ec = fStack_5ac + fStack_cc0;
  local_6a8 = CONCAT44(fStack_5f4,local_efc);
  uStack_6a0 = CONCAT44(fStack_5ec,fStack_5f0);
  local_b88 = ZEXT416((uint)local_efc);
  local_f18 = CONCAT44(0,local_efc);
  uStack_f10 = 0;
  uStack_b50 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_f18;
  local_f28 = rsqrtss(auVar2,auVar2);
  local_b8c = 0x3fc00000;
  local_ba8 = ZEXT416(0x3fc00000);
  local_9e8 = local_f28._0_8_;
  uVar6 = local_9e8;
  uStack_9e0 = local_f28._8_8_;
  local_9e8._0_4_ = local_f28._0_4_;
  local_9d8 = (ulong)(uint)((float)local_9e8 * 1.5);
  uStack_9d0 = 0;
  local_bac = 0xbf000000;
  local_bc8 = ZEXT416(0xbf000000);
  local_a08 = local_bc8._0_8_;
  uStack_a00 = 0;
  local_9f8 = (ulong)(uint)(local_efc * -0.5);
  uStack_9f0 = 0;
  local_a28 = local_f28._0_8_;
  uStack_a20 = local_f28._8_8_;
  local_f7c = local_efc * -0.5 * (float)local_9e8;
  local_a18 = (ulong)(uint)local_f7c;
  uStack_a10 = 0;
  local_a48 = local_f28._0_8_;
  uStack_a40 = local_f28._8_8_;
  local_a38 = CONCAT44(local_f28._4_4_,(float)local_9e8 * (float)local_9e8);
  uStack_a30 = local_f28._8_8_;
  local_a68 = local_a38;
  uStack_a60 = local_f28._8_8_;
  local_f7c = local_f7c * (float)local_9e8 * (float)local_9e8;
  local_a58 = (ulong)(uint)local_f7c;
  uStack_a50 = 0;
  local_b28 = local_a58;
  uStack_b20 = 0;
  local_f7c = (float)local_9e8 * 1.5 + local_f7c;
  local_b18 = (ulong)(uint)local_f7c;
  uStack_b10 = 0;
  local_f38 = local_b18;
  uStack_f30 = 0;
  local_9b8 = local_b18;
  uStack_9b0 = 0;
  local_e60 = &local_f98;
  local_e28 = CONCAT44(local_f7c,local_f7c);
  uStack_e20 = CONCAT44(local_f7c,local_f7c);
  local_e48 = (float)local_c98 * local_f7c;
  fStack_e44 = local_c98._4_4_ * local_f7c;
  fStack_e40 = (float)uStack_c90 * local_f7c;
  fStack_e3c = local_f7c * 0.0;
  local_1708 = CONCAT44(fStack_e44,local_e48);
  uStack_1700 = CONCAT44(fStack_e3c,fStack_e40);
  local_1510 = &local_1648;
  local_1488 = *(undefined8 *)*local_15e8;
  uStack_1480 = *(undefined8 *)(local_1658 + 0x18);
  local_1470 = &local_1538;
  auVar4._8_8_ = uStack_1610;
  auVar4._0_8_ = local_1618;
  local_1490 = local_1558;
  local_1400 = &local_1548;
  fStack_1380 = (float)local_1618;
  auVar7._12_4_ = (float)((ulong)uStack_1610 >> 0x20);
  auVar7._0_8_ = auVar4._4_8_;
  auVar7._8_4_ = fStack_1380;
  local_1338._8_8_ = auVar7._8_8_;
  uStack_13f0 = local_1338._8_8_;
  uStack_1540 = local_1338._8_8_;
  local_14c8 = *(undefined8 *)*local_15e8;
  uStack_14c0 = *(undefined8 *)(local_1658 + 0x18);
  auVar1 = *local_15e8;
  local_14b0 = &local_1578;
  local_1430 = &local_1568;
  auVar8._12_4_ = (float)((ulong)uStack_14c0 >> 0x20);
  auVar8._0_8_ = auVar1._4_8_;
  auVar8._8_4_ = (float)local_14c8;
  local_1328._8_8_ = auVar8._8_8_;
  uStack_1420 = local_1328._8_8_;
  uStack_1560 = local_1328._8_8_;
  local_14d0 = local_1588;
  local_13c0 = &local_15b8;
  uStack_1220 = local_1328._8_8_;
  local_1228._0_4_ = auVar1._4_4_;
  local_1228._4_4_ = auVar1._8_4_;
  fStack_1234 = (float)((ulong)local_1618 >> 0x20);
  fStack_1230 = (float)uStack_1610;
  local_1358 = (float)local_1228 * fStack_1380;
  fStack_1354 = local_1228._4_4_ * fStack_1234;
  fStack_1350 = (float)local_14c8 * fStack_1230;
  fStack_134c = auVar8._12_4_ * auVar7._12_4_;
  local_1468 = &local_15a8;
  local_1390 = &local_13d8;
  uStack_1210 = local_1338._8_8_;
  local_1208._0_4_ = (float)local_1488;
  local_1208._4_4_ = (float)((ulong)local_1488 >> 0x20);
  uStack_1200._0_4_ = (float)uStack_1480;
  uStack_1200._4_4_ = (float)((ulong)uStack_1480 >> 0x20);
  local_1388 = (float)local_1208 * fStack_1234;
  fStack_1384 = local_1208._4_4_ * fStack_1230;
  fStack_1380 = (float)uStack_1200 * fStack_1380;
  fStack_137c = uStack_1200._4_4_ * auVar7._12_4_;
  local_1278 = CONCAT44(fStack_1384,local_1388);
  uStack_1270 = CONCAT44(fStack_137c,fStack_1380);
  local_1288 = (float)local_15b8;
  fStack_1284 = (float)((ulong)local_15b8 >> 0x20);
  fStack_1280 = (float)uStack_15b0;
  fStack_127c = (float)((ulong)uStack_15b0 >> 0x20);
  local_1268 = local_1388 - local_1288;
  fStack_1264 = fStack_1384 - fStack_1284;
  fStack_1260 = fStack_1380 - fStack_1280;
  auVar9._12_4_ = fStack_137c - fStack_127c;
  local_12e8 = CONCAT44(fStack_1264,local_1268);
  uStack_12e0 = CONCAT44(auVar9._12_4_,fStack_1260);
  local_1460 = &local_1598;
  auVar3._8_8_ = uStack_12e0;
  auVar3._0_8_ = local_12e8;
  auVar9._0_8_ = auVar3._4_8_;
  auVar9._8_4_ = local_1268;
  local_1318._8_8_ = auVar9._8_8_;
  uStack_1450 = local_1318._8_8_;
  uStack_1590 = local_1318._8_8_;
  uStack_1500 = local_1318._8_8_;
  uStack_1640 = local_1318._8_8_;
  local_10f0 = &local_1638;
  local_d30 = &local_1048;
  uStack_cf0 = local_1318._8_8_;
  uStack_d00 = local_1318._8_8_;
  local_d28 = fStack_1264 * fStack_1264;
  fStack_d24 = fStack_1260 * fStack_1260;
  fStack_d20 = local_1268 * local_1268;
  fStack_d1c = auVar9._12_4_ * auVar9._12_4_;
  local_758 = CONCAT44(fStack_d24,local_d28);
  uStack_750 = CONCAT44(fStack_d1c,fStack_d20);
  local_748 = &local_778;
  local_678 = &local_788;
  local_338 = CONCAT44(fStack_d24,fStack_d24);
  uStack_330 = CONCAT44(fStack_d24,fStack_d24);
  local_638 = &local_798;
  local_1b8 = CONCAT44(fStack_d20,fStack_d20);
  uStack_1b0 = CONCAT44(fStack_d20,fStack_d20);
  local_588 = &local_7b8;
  local_538 = local_d28 + fStack_d24;
  fStack_534 = fStack_d24 + fStack_d24;
  fStack_530 = fStack_d20 + fStack_d24;
  fStack_52c = fStack_d1c + fStack_d24;
  local_58 = CONCAT44(fStack_534,local_538);
  uStack_50 = CONCAT44(fStack_52c,fStack_530);
  local_740 = &local_7a8;
  local_ec4 = local_538 + fStack_d20;
  fStack_574 = fStack_534 + fStack_d20;
  fStack_570 = fStack_530 + fStack_d20;
  fStack_56c = fStack_52c + fStack_d20;
  local_738 = CONCAT44(fStack_574,local_ec4);
  uStack_730 = CONCAT44(fStack_56c,fStack_570);
  local_be8 = ZEXT416((uint)local_ec4);
  local_ed8 = CONCAT44(0,local_ec4);
  uStack_ed0 = 0;
  uStack_b60 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_ed8;
  local_ee8 = rsqrtss(auVar1,auVar1);
  local_bec = 0x3fc00000;
  local_c08 = ZEXT416(0x3fc00000);
  local_a88 = local_ee8._0_8_;
  uVar5 = local_a88;
  uStack_a80 = local_ee8._8_8_;
  local_a88._0_4_ = local_ee8._0_4_;
  local_a78 = (ulong)(uint)((float)local_a88 * 1.5);
  uStack_a70 = 0;
  local_c0c = 0xbf000000;
  local_c28 = ZEXT416(0xbf000000);
  local_aa8 = local_c28._0_8_;
  uStack_aa0 = 0;
  local_a98 = (ulong)(uint)(local_ec4 * -0.5);
  uStack_a90 = 0;
  local_ac8 = local_ee8._0_8_;
  uStack_ac0 = local_ee8._8_8_;
  local_f4c = local_ec4 * -0.5 * (float)local_a88;
  local_ab8 = (ulong)(uint)local_f4c;
  uStack_ab0 = 0;
  local_ae8 = local_ee8._0_8_;
  uStack_ae0 = local_ee8._8_8_;
  local_ad8 = CONCAT44(local_ee8._4_4_,(float)local_a88 * (float)local_a88);
  uStack_ad0 = local_ee8._8_8_;
  local_b08 = local_ad8;
  uStack_b00 = local_ee8._8_8_;
  local_f4c = local_f4c * (float)local_a88 * (float)local_a88;
  local_af8 = (ulong)(uint)local_f4c;
  uStack_af0 = 0;
  local_b48 = local_af8;
  uStack_b40 = 0;
  local_f4c = (float)local_a88 * 1.5 + local_f4c;
  local_b38 = (ulong)(uint)local_f4c;
  uStack_b30 = 0;
  local_ef8 = local_b38;
  uStack_ef0 = 0;
  local_9c8 = local_b38;
  uStack_9c0 = 0;
  local_ec0 = &local_f68;
  local_e88 = CONCAT44(local_f4c,local_f4c);
  uStack_e80 = CONCAT44(local_f4c,local_f4c);
  uStack_e70 = local_1318._8_8_;
  local_ea8 = fStack_1264 * local_f4c;
  fStack_ea4 = fStack_1260 * local_f4c;
  fStack_ea0 = local_1268 * local_f4c;
  fStack_e9c = auVar9._12_4_ * local_f4c;
  local_1638 = CONCAT44(fStack_ea4,local_ea8);
  uStack_1630 = CONCAT44(fStack_e9c,fStack_ea0);
  local_15c8 = &local_1708;
  local_fb0 = local_16f8;
  local_fa0 = &local_16e8;
  local_16e8 = *(undefined8 *)*local_15e8;
  uStack_16e0 = *(undefined8 *)(local_1658 + 0x18);
  local_15c0 = &local_16d8;
  local_11e8 = local_16c8;
  local_11f0 = local_16b8;
  local_11d8 = &local_16a8;
  local_11a8 = local_16f8;
  local_11a0 = local_16c8;
  local_11b8 = &local_16e8;
  local_11b0 = local_16b8;
  local_11c0 = &local_15d8;
  local_1178 = 0;
  uStack_1170 = 0;
  local_15d8 = 0;
  uStack_15d0 = 0;
  local_16a8 = 0;
  uStack_16a0 = 0;
  local_1518 = local_15e8;
  local_1508 = auVar9._0_8_;
  local_14f0 = local_1510;
  local_1458 = auVar9._0_8_;
  local_1440 = local_1460;
  local_1438 = local_14b0;
  local_1428 = auVar8._0_8_;
  local_1410 = local_1430;
  local_1408 = local_1490;
  local_13f8 = auVar7._0_8_;
  local_13e0 = local_1400;
  local_13b8 = local_1400;
  local_13b0 = local_1470;
  local_13a8 = local_1468;
  local_13a0 = local_1400;
  local_1398 = local_1470;
  local_1378 = local_1390;
  local_1370 = local_14d0;
  local_1368 = local_1430;
  local_1360 = local_13c0;
  local_1348 = local_13c0;
  local_1340 = local_1460;
  local_1338 = auVar7;
  local_1328 = auVar8;
  local_1318 = auVar9;
  local_12f8 = local_14c8;
  uStack_12f0 = uStack_14c0;
  local_12d8 = local_14d0;
  local_12d0 = local_1430;
  local_12c8 = local_1400;
  local_12c0 = local_1470;
  local_12b8 = local_1490;
  local_12b0 = local_14b0;
  local_12a8 = local_1468;
  local_12a0 = local_13c0;
  local_1298 = local_1390;
  local_1290 = local_1468;
  fStack_125c = auVar9._12_4_;
  local_1250 = local_1468;
  local_1248 = local_13c0;
  local_1240 = local_1390;
  local_1228 = auVar8._0_8_;
  local_1218 = auVar7._0_8_;
  local_1208 = local_1488;
  uStack_1200 = uStack_1480;
  local_11f8 = local_15c0;
  local_11e0 = local_15c0;
  local_11d0 = local_15c8;
  local_11c8 = local_15c0;
  local_1198 = local_15c8;
  local_1190 = local_15c0;
  local_1188 = local_11c0;
  local_1180 = local_11d8;
  local_1124 = local_1148;
  local_1120 = local_114c;
  local_1108 = local_115c;
  local_1100 = local_1164;
  local_10f8 = local_1510;
  local_10e0 = local_1520;
  local_10d8 = name;
  pXStack_10d0 = this_00;
  local_1090 = local_10e8;
  local_1058 = local_10e8;
  local_1050 = local_10e8;
  local_1038 = local_1510;
  local_1030 = local_1510;
  local_1018 = local_1158;
  local_1010 = local_1158;
  local_ff8 = local_1140;
  local_ff0 = local_1140;
  local_fe8 = local_15e8;
  local_fe0 = local_10f0;
  local_fd8 = local_1520;
  local_fd0 = local_15c8;
  local_fc8 = local_1520;
  local_fc0 = local_15c8;
  local_fb8 = local_10f0;
  local_fa8 = local_15e8;
  local_f78 = local_10e8;
  local_f70 = local_1520;
  local_f48 = local_1510;
  local_f40 = local_10f0;
  local_eb8 = local_1510;
  local_eb0 = local_10f0;
  local_e90 = local_10f0;
  local_e78 = auVar9._0_8_;
  local_e58 = local_10e8;
  local_e50 = local_1520;
  local_e30 = local_1520;
  local_e18 = local_10a8;
  uStack_e10 = uStack_10a0;
  local_e00 = local_1140;
  local_df8 = local_1140;
  local_dd0 = local_df0;
  local_dc8 = local_1138;
  uStack_dc0 = uStack_1130;
  local_db8 = local_1138;
  uStack_db0 = uStack_1130;
  local_da0 = local_1158;
  local_d98 = local_1158;
  local_d70 = local_d90;
  local_d68 = local_1118;
  uStack_d60 = uStack_1110;
  local_d58 = local_1118;
  uStack_d50 = uStack_1110;
  local_d40 = local_1510;
  local_d38 = local_1510;
  local_d10 = local_d30;
  local_d08 = auVar9._0_8_;
  local_cf8 = auVar9._0_8_;
  local_ce0 = local_10e8;
  local_cd8 = local_10e8;
  local_cb0 = local_cd0;
  local_ca8 = local_10a8;
  uStack_ca0 = uStack_10a0;
  local_c98 = local_10a8;
  uStack_c90 = uStack_10a0;
  local_c84 = local_f4c;
  local_c80 = local_ec0;
  local_c74 = local_f7c;
  local_c70 = local_e60;
  local_c68 = local_f7c;
  fStack_c64 = local_f7c;
  fStack_c60 = local_f7c;
  fStack_c5c = local_f7c;
  local_c4c = local_f7c;
  local_c48 = local_f4c;
  fStack_c44 = local_f4c;
  fStack_c40 = local_f4c;
  fStack_c3c = local_f4c;
  local_c2c = local_f4c;
  local_bcc = local_ec4;
  local_b6c = local_efc;
  local_b68 = local_ed8;
  local_b58 = local_f18;
  local_a88 = uVar5;
  local_9e8 = uVar6;
  local_968 = name;
  pXStack_960 = this_00;
  local_958 = local_1138;
  uStack_950 = uStack_1130;
  local_948 = local_1118;
  uStack_940 = uStack_1110;
  local_918 = local_1138;
  uStack_910 = uStack_1130;
  local_908 = name;
  pXStack_900 = this_00;
  local_8f8 = local_1118;
  uStack_8f0 = uStack_1110;
  local_8e8 = name;
  pXStack_8e0 = this_00;
  local_880 = local_df0;
  local_7f0 = local_d90;
  local_760 = local_d30;
  local_6d0 = local_cd0;
  local_690 = local_6b8;
  local_680 = local_748;
  local_670 = local_7d8;
  local_660 = local_868;
  local_650 = local_6b8;
  local_640 = local_748;
  local_630 = local_7d8;
  local_620 = local_868;
  local_610 = local_648;
  local_600 = local_6b0;
  local_5f8 = local_efc;
  local_5e8 = local_6b0;
  local_5e0 = local_648;
  local_5d8 = local_608;
  local_5d0 = local_688;
  local_5c8 = local_6b8;
  local_5c0 = local_608;
  local_5a8 = local_608;
  local_5a0 = local_688;
  local_598 = local_6b8;
  local_590 = local_638;
  local_580 = local_740;
  local_578 = local_ec4;
  local_568 = local_740;
  local_560 = local_638;
  local_558 = local_588;
  local_550 = local_678;
  local_548 = local_748;
  local_540 = local_588;
  local_528 = local_588;
  local_520 = local_678;
  local_518 = local_748;
  local_510 = local_628;
  local_500 = local_7d0;
  local_4e8 = local_7d0;
  local_4e0 = local_628;
  local_4d8 = local_508;
  local_4d0 = local_668;
  local_4c8 = local_7d8;
  local_4c0 = local_508;
  local_4a8 = local_508;
  local_4a0 = local_668;
  local_498 = local_7d8;
  local_490 = local_618;
  local_480 = local_860;
  local_468 = local_860;
  local_460 = local_618;
  local_458 = local_488;
  local_450 = local_658;
  local_448 = local_868;
  local_440 = local_488;
  local_420 = local_488;
  local_418 = local_658;
  local_410 = local_868;
  local_408 = local_868;
  local_400 = local_658;
  local_3e0 = local_658;
  local_3d8 = fStack_de4;
  fStack_3d4 = fStack_de4;
  fStack_3d0 = fStack_de4;
  fStack_3cc = fStack_de4;
  local_3c8 = local_878;
  uStack_3c0 = uStack_870;
  local_3b0 = local_868;
  local_3a8 = local_7d8;
  local_3a0 = local_668;
  local_380 = local_668;
  local_378 = uStack_d84;
  uStack_374 = uStack_d84;
  uStack_370 = uStack_d84;
  uStack_36c = uStack_d84;
  local_368 = local_7e8;
  uStack_360 = uStack_7e0;
  local_350 = local_7d8;
  local_348 = local_748;
  local_340 = local_678;
  local_320 = local_678;
  local_318 = fStack_d24;
  fStack_314 = fStack_d24;
  fStack_310 = fStack_d24;
  fStack_30c = fStack_d24;
  local_308 = local_758;
  uStack_300 = uStack_750;
  local_2f0 = local_748;
  local_2e8 = local_6b8;
  local_2e0 = local_688;
  local_2c0 = local_688;
  local_2b8 = fStack_cc4;
  fStack_2b4 = fStack_cc4;
  fStack_2b0 = fStack_cc4;
  fStack_2ac = fStack_cc4;
  local_2a8 = local_6c8;
  uStack_2a0 = uStack_6c0;
  local_290 = local_6b8;
  local_288 = local_868;
  local_280 = local_618;
  local_260 = local_618;
  local_258 = fStack_de0;
  fStack_254 = fStack_de0;
  fStack_250 = fStack_de0;
  fStack_24c = fStack_de0;
  local_248 = local_878;
  uStack_240 = uStack_870;
  local_230 = local_868;
  local_228 = local_7d8;
  local_220 = local_628;
  local_200 = local_628;
  local_1f8 = fStack_d80;
  fStack_1f4 = fStack_d80;
  fStack_1f0 = fStack_d80;
  fStack_1ec = fStack_d80;
  local_1e8 = local_7e8;
  uStack_1e0 = uStack_7e0;
  local_1d0 = local_7d8;
  local_1c8 = local_748;
  local_1c0 = local_638;
  local_1a0 = local_638;
  local_198 = fStack_d20;
  fStack_194 = fStack_d20;
  fStack_190 = fStack_d20;
  fStack_18c = fStack_d20;
  local_188 = local_758;
  uStack_180 = uStack_750;
  local_170 = local_748;
  local_168 = local_6b8;
  local_160 = local_648;
  local_140 = local_648;
  local_138 = fStack_cc0;
  fStack_134 = fStack_cc0;
  fStack_130 = fStack_cc0;
  fStack_12c = fStack_cc0;
  local_128 = local_6c8;
  uStack_120 = uStack_6c0;
  local_110 = local_6b8;
  local_108 = local_3f8;
  uStack_100 = uStack_3f0;
  local_f8 = local_878;
  uStack_f0 = uStack_870;
  local_e8 = local_278;
  uStack_e0 = uStack_270;
  local_c8 = local_398;
  uStack_c0 = uStack_390;
  local_b8 = local_7e8;
  uStack_b0 = uStack_7e0;
  local_a8 = local_218;
  uStack_a0 = uStack_210;
  local_88 = local_338;
  uStack_80 = uStack_330;
  local_78 = local_758;
  uStack_70 = uStack_750;
  local_68 = local_1b8;
  uStack_60 = uStack_1b0;
  local_48 = local_2d8;
  uStack_40 = uStack_2d0;
  local_38 = local_6c8;
  uStack_30 = uStack_6c0;
  local_28 = local_158;
  uStack_20 = uStack_150;
  local_16d8 = local_1708;
  uStack_16d0 = uStack_1700;
  local_1648 = auVar9._0_8_;
  local_1628 = local_10a8;
  uStack_1620 = uStack_10a0;
  local_1618 = local_1708;
  uStack_1610 = uStack_1700;
  local_1608 = local_1118;
  uStack_1600 = uStack_1110;
  local_15f8 = local_1138;
  uStack_15f0 = uStack_1130;
  local_15b8 = CONCAT44(fStack_1354,local_1358);
  uStack_15b0 = CONCAT44(fStack_134c,fStack_1350);
  local_15a8 = local_12e8;
  uStack_15a0 = uStack_12e0;
  local_1598 = auVar9._0_8_;
  local_1578 = local_14c8;
  uStack_1570 = uStack_14c0;
  local_1568 = auVar8._0_8_;
  local_1548 = auVar7._0_8_;
  local_1538 = local_1488;
  uStack_1530 = uStack_1480;
  local_13d8 = local_1278;
  uStack_13d0 = uStack_1270;
  local_1068 = local_6c8;
  uStack_1060 = uStack_6c0;
  local_1048 = local_758;
  uStack_1040 = uStack_750;
  local_1028 = local_7e8;
  uStack_1020 = uStack_7e0;
  local_1008 = local_878;
  uStack_1000 = uStack_870;
  local_f98 = local_e28;
  uStack_f90 = uStack_e20;
  local_f68 = local_e88;
  uStack_f60 = uStack_e80;
  local_8d8 = local_d8;
  uStack_8d0 = uStack_d0;
  local_8c8 = local_858;
  uStack_8c0 = uStack_850;
  local_8b8 = local_278;
  uStack_8b0 = uStack_270;
  local_8a8 = local_3f8;
  uStack_8a0 = uStack_3f0;
  local_898 = local_878;
  uStack_890 = uStack_870;
  local_848 = local_98;
  uStack_840 = uStack_90;
  local_838 = local_7c8;
  uStack_830 = uStack_7c0;
  local_828 = local_218;
  uStack_820 = uStack_210;
  local_818 = local_398;
  uStack_810 = uStack_390;
  local_808 = local_7e8;
  uStack_800 = uStack_7e0;
  local_7b8 = local_58;
  uStack_7b0 = uStack_50;
  local_7a8 = local_738;
  uStack_7a0 = uStack_730;
  local_798 = local_1b8;
  uStack_790 = uStack_1b0;
  local_788 = local_338;
  uStack_780 = uStack_330;
  local_778 = local_758;
  uStack_770 = uStack_750;
  local_728 = local_18;
  uStack_720 = uStack_10;
  local_718 = local_6a8;
  uStack_710 = uStack_6a0;
  local_708 = local_158;
  uStack_700 = uStack_150;
  local_6f8 = local_2d8;
  uStack_6f0 = uStack_2d0;
  local_6e8 = local_6c8;
  uStack_6e0 = uStack_6c0;
  store(this_00,name,in_stack_ffffffffffffe8a0);
  store(this_00,name,(Vec3fa *)in_stack_ffffffffffffe8a0);
  paVar10 = &local_1729;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1728,"DirectionalLight",paVar10);
  close(in_RDI,(int)local_1728);
  std::__cxx11::string::~string(local_1728);
  std::allocator<char>::~allocator((allocator<char> *)&local_1729);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::DirectionalLight& light, ssize_t id)
  {
    open("DirectionalLight",id);
    store("AffineSpace",frame(light.D));
    store("E",light.E);
    close("DirectionalLight");
  }